

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

JsDiagDebugEvent __thiscall
JsrtDebugManager::GetDebugEventFromStopType(JsrtDebugManager *this,StopType stopType)

{
  JsDiagDebugEvent JVar1;
  
  JVar1 = JsDiagDebugEventBreakpoint;
  if (stopType - STOP_INLINEBREAKPOINT < 4) {
    JVar1 = *(JsDiagDebugEvent *)(&DAT_00fe24f8 + (ulong)(stopType - STOP_INLINEBREAKPOINT) * 4);
  }
  return JVar1;
}

Assistant:

JsDiagDebugEvent JsrtDebugManager::GetDebugEventFromStopType(Js::StopType stopType)
{
    switch (stopType)
    {
    case Js::STOP_BREAKPOINT: return JsDiagDebugEventBreakpoint;
    case Js::STOP_INLINEBREAKPOINT: return JsDiagDebugEventDebuggerStatement;
    case Js::STOP_STEPCOMPLETE: return JsDiagDebugEventStepComplete;
    case Js::STOP_EXCEPTIONTHROW: return JsDiagDebugEventRuntimeException;
    case Js::STOP_ASYNCBREAK: return JsDiagDebugEventAsyncBreak;

    case Js::STOP_MUTATIONBREAKPOINT:
    default:
        Assert("Unhandled stoptype");
        break;
    }

    return JsDiagDebugEventBreakpoint;
}